

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O1

void __thiscall Editor::saveAsBoard(Editor *this,path *filename,bool overwriteFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  source_loc loc;
  bool bVar4;
  path *ppVar5;
  logger *plVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view_t fmt;
  string ret;
  path saveFilename;
  settings tmp;
  allocator_type local_159;
  string_type local_158;
  string local_138;
  file_dialog local_118;
  path local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  ghc::filesystem::path::path(&local_108);
  bVar4 = ghc::filesystem::path::empty(filename);
  if (bVar4) {
    pfd::settings::settings((settings *)&local_e8,false);
    if ((((pfd::settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
         (pfd::settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
        (pfd::settings::flags(pfd::settings::flag)::flags._4_1_ == '\0')) &&
       (pfd::settings::flags(pfd::settings::flag)::flags._5_1_ == '\0')) {
      plVar6 = spdlog::default_logger_raw();
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      spdlog::logger::log(plVar6,0.0);
      ppVar5 = Board::getFilename(this->board_);
      EditorInterface::showFileDialog(&this->interface_,false,ppVar5);
      goto LAB_00146f2c;
    }
    Board::getDefaultFileExtension((path *)&local_158,this->board_);
    paVar2 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,".txt","");
    paVar1 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_138,local_e8._M_dataplus._M_p,
               local_e8._M_dataplus._M_p + local_e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    ghc::filesystem::path::postprocess_path_with_format((path *)&local_138,auto_format);
    bVar4 = ghc::filesystem::operator==((path *)&local_158,(path *)&local_138);
    ghc::filesystem::path::~path((path *)&local_138);
    ghc::filesystem::path::~path((path *)&local_158);
    if (bVar4) {
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Save As","");
      ppVar5 = Board::getFilename(this->board_);
      ghc::filesystem::path::string_abi_cxx11_(&local_50,ppVar5);
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Plain Text (*.txt)","");
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"*.txt","");
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"All Files (*.*)","");
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"*","");
      __l._M_len = 4;
      __l._M_array = &local_e8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,__l,&local_159);
      pfd::internal::file_dialog::file_dialog(&local_118,save,&local_138,&local_50,&local_68,none);
      do {
        bVar4 = pfd::internal::executor::ready
                          (local_118.super_dialog.m_async.
                           super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,0x14);
      } while (!bVar4);
      pcVar3 = ((local_118.super_dialog.m_async.
                 super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_stdout)._M_dataplus._M_p;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar3,
                 pcVar3 + ((local_118.super_dialog.m_async.
                            super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_stdout)._M_string_length);
      while ((local_158._M_string_length != 0 &&
             ((local_158._M_dataplus._M_p[local_158._M_string_length - 1] == '/' ||
              (local_158._M_dataplus._M_p[local_158._M_string_length - 1] == '\n'))))) {
        std::__cxx11::string::pop_back();
      }
      ghc::filesystem::path::operator=(&local_108,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if (local_118.super_dialog.m_async.
          super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super_dialog.m_async.
                   super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      lVar7 = 0;
      do {
        if (local_78 + lVar7 != *(undefined1 **)((long)local_88 + lVar7)) {
          operator_delete(*(undefined1 **)((long)local_88 + lVar7));
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      overwriteFile = true;
    }
    else {
      Board::getDefaultFileExtension((path *)&local_158,this->board_);
      local_e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_138,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      ghc::filesystem::path::postprocess_path_with_format((path *)&local_138,auto_format);
      bVar4 = ghc::filesystem::operator==((path *)&local_158,(path *)&local_138);
      ghc::filesystem::path::~path((path *)&local_138);
      ghc::filesystem::path::~path((path *)&local_158);
      overwriteFile = true;
      if (bVar4) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Save As","");
        ppVar5 = Board::getFilename(this->board_);
        ghc::filesystem::path::string_abi_cxx11_(&local_50,ppVar5);
        local_e8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"All Files (*.*)","");
        local_c8[0] = local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"*","");
        __l_00._M_len = 2;
        __l_00._M_array = &local_e8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,__l_00,&local_159);
        pfd::internal::file_dialog::file_dialog(&local_118,save,&local_138,&local_50,&local_68,none)
        ;
        do {
          bVar4 = pfd::internal::executor::ready
                            (local_118.super_dialog.m_async.
                             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,0x14);
        } while (!bVar4);
        pcVar3 = ((local_118.super_dialog.m_async.
                   super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_stdout)._M_dataplus._M_p;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar3,
                   pcVar3 + ((local_118.super_dialog.m_async.
                              super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_stdout)._M_string_length);
        while ((local_158._M_string_length != 0 &&
               ((local_158._M_dataplus._M_p[local_158._M_string_length - 1] == '/' ||
                (local_158._M_dataplus._M_p[local_158._M_string_length - 1] == '\n'))))) {
          std::__cxx11::string::pop_back();
        }
        ghc::filesystem::path::operator=(&local_108,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (local_118.super_dialog.m_async.
            super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super_dialog.m_async.
                     super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        lVar7 = 0;
        do {
          if (local_b8 + lVar7 != *(undefined1 **)((long)local_c8 + lVar7)) {
            operator_delete(*(undefined1 **)((long)local_c8 + lVar7));
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    ghc::filesystem::path::operator=(&local_108,filename);
  }
  bVar4 = ghc::filesystem::path::empty(&local_108);
  if (bVar4) {
    plVar6 = spdlog::default_logger_raw();
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    spdlog::logger::log(plVar6,0.0);
  }
  else if ((overwriteFile == false) && (bVar4 = ghc::filesystem::exists(&local_108), bVar4)) {
    EditorInterface::showOverwriteDialog(&this->interface_,&local_108);
  }
  else {
    plVar6 = spdlog::default_logger_raw();
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x11;
    fmt.data_ = "Saving to \"{}\"...";
    spdlog::logger::log_<ghc::filesystem::path&>(plVar6,loc,info,fmt,&local_108);
    Board::saveAsFile(this->board_,&local_108);
    this->savedEditSize_ = this->lastEditSize_;
  }
LAB_00146f2c:
  ghc::filesystem::path::~path(&local_108);
  return;
}

Assistant:

void Editor::saveAsBoard(const fs::path& filename, bool overwriteFile) {
    fs::path saveFilename;
    if (!filename.empty()) {
        saveFilename = filename;
    } else if (pfd::settings::available()) {
        if (board_.getDefaultFileExtension() == ".txt") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "Plain Text (*.txt)", "*.txt",
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else if (board_.getDefaultFileExtension() == "") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else {
            assert(false);
        }

        // The pfd call will prompt the user if overwriting, so skip our check for existing file.
        overwriteFile = true;
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(false, board_.getFilename());
    }

    if (!saveFilename.empty()) {
        if (!overwriteFile && fs::exists(saveFilename)) {
            return interface_.showOverwriteDialog(saveFilename);
        }

        spdlog::info("Saving to \"{}\"...", saveFilename);
        board_.saveAsFile(saveFilename);
        savedEditSize_ = lastEditSize_;
    } else {
        spdlog::info("No file selected.");
    }
}